

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

void __thiscall soul::heart::StructElement::~StructElement(StructElement *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Expression).super_Object._vptr_Object = (_func_int **)&PTR__StructElement_003072d8;
  pcVar2 = (this->memberName)._M_dataplus._M_p;
  paVar1 = &(this->memberName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  Object::~Object((Object *)this);
  return;
}

Assistant:

StructElement() = delete;